

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O0

const_iterator __thiscall
frozen::
unordered_set<frozen::basic_string<char>,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
::
find<frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
          (unordered_set<frozen::basic_string<char>,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
           *this,basic_string<char> *key,elsa<frozen::basic_string<char>_> *hash,
          equal_to<frozen::basic_string<char>_> *equal)

{
  bool bVar1;
  size_t sVar2;
  const_iterator pvVar3;
  unordered_set<frozen::basic_string<char>,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
  *puVar4;
  const_iterator it;
  size_t pos;
  equal_to<frozen::basic_string<char>_> *equal_local;
  elsa<frozen::basic_string<char>_> *hash_local;
  basic_string<char> *key_local;
  unordered_set<frozen::basic_string<char>,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
  *this_local;
  
  sVar2 = bits::pmh_tables<128ul,frozen::elsa<frozen::basic_string<char>>>::
          lookup<frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>>
                    ((pmh_tables<128ul,frozen::elsa<frozen::basic_string<char>>> *)(this + 0x800),
                     key,hash);
  pvVar3 = bits::carray<frozen::basic_string<char>,_128UL>::begin
                     ((carray<frozen::basic_string<char>,_128UL> *)this);
  this_local = (unordered_set<frozen::basic_string<char>,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                *)(pvVar3 + sVar2);
  puVar4 = (unordered_set<frozen::basic_string<char>,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
            *)bits::carray<frozen::basic_string<char>,_128UL>::end
                        ((carray<frozen::basic_string<char>,_128UL> *)this);
  if ((this_local == puVar4) ||
     (bVar1 = std::equal_to<frozen::basic_string<char>_>::operator()
                        (equal,(basic_string<char> *)this_local,key), !bVar1)) {
    this_local = (unordered_set<frozen::basic_string<char>,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                  *)bits::carray<frozen::basic_string<char>,_128UL>::end
                              ((carray<frozen::basic_string<char>,_128UL> *)this);
  }
  return (const_iterator)this_local;
}

Assistant:

constexpr const_iterator find(KeyType const &key, Hasher const &hash, Equal const &equal) const {
    auto const pos = tables_.lookup(key, hash);
    auto it = keys_.begin() + pos;
    if (it != keys_.end() && equal(*it, key))
      return it;
    else
      return keys_.end();
  }